

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O0

TrackSet<ASDCP::MXF::TimecodeComponent> *
ASDCP::MXF::CreateTimecodeTrack<ASDCP::MXF::MaterialPackage>
          (TrackSet<ASDCP::MXF::TimecodeComponent> *__return_storage_ptr__,OP1aHeader *Header,
          MaterialPackage *Package,Rational *tc_edit_rate,ui32_t tc_frame_rate,ui64_t TCStart,
          Dictionary *Dict)

{
  byte_t *value;
  TimecodeComponent *this;
  undefined4 in_stack_ffffffffffffff3c;
  Dictionary *in_stack_ffffffffffffff48;
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  UL TCUL;
  ui64_t TCStart_local;
  ui32_t tc_frame_rate_local;
  Rational *tc_edit_rate_local;
  MaterialPackage *Package_local;
  OP1aHeader *Header_local;
  
  TCUL.super_Identifier<16U>._24_8_ = TCStart;
  if (Dict != (Dictionary *)0x0) {
    value = Dictionary::ul(Dict,MDD_TimecodeDataDef);
    UL::UL((UL *)local_50,value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"Timecode Track",&local_71);
    CreateTrackAndSequence<ASDCP::MXF::MaterialPackage,ASDCP::MXF::TimecodeComponent>
              (__return_storage_ptr__,(MXF *)Header,(OP1aHeader *)Package,
               (MaterialPackage *)local_70,(string *)tc_edit_rate,(Rational *)local_50,
               (UL *)CONCAT44(in_stack_ffffffffffffff3c,1),(ui32_t)Dict,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    this = (TimecodeComponent *)operator_new(0xe8);
    ASDCP::MXF::TimecodeComponent::TimecodeComponent(this,Dict);
    __return_storage_ptr__->Clip = this;
    (**(code **)(*(long *)Header + 0x68))(Header,__return_storage_ptr__->Clip);
    std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
              ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
               (__return_storage_ptr__->Sequence + 0xd8),
               (value_type *)(__return_storage_ptr__->Clip + 0x58));
    TCStart_local._4_2_ = (undefined2)tc_frame_rate;
    *(undefined2 *)(__return_storage_ptr__->Clip + 0xd0) = TCStart_local._4_2_;
    *(undefined8 *)(__return_storage_ptr__->Clip + 0xd8) = TCUL.super_Identifier<16U>._24_8_;
    UL::operator=((UL *)(__return_storage_ptr__->Clip + 0xa0),(UL *)local_50);
    UL::~UL((UL *)local_50);
    return __return_storage_ptr__;
  }
  __assert_fail("Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                ,0x21c,
                "TrackSet<TimecodeComponent> ASDCP::MXF::CreateTimecodeTrack(OP1aHeader &, PackageT &, const MXF::Rational &, ui32_t, ui64_t, const Dictionary *) [PackageT = ASDCP::MXF::MaterialPackage]"
               );
}

Assistant:

TrackSet<TimecodeComponent>
	CreateTimecodeTrack(OP1aHeader& Header, PackageT& Package,
			    const MXF::Rational& tc_edit_rate, ui32_t tc_frame_rate, ui64_t TCStart, const Dictionary *Dict)
	{
	  assert(Dict);
	  UL TCUL(Dict->ul(MDD_TimecodeDataDef));

	  TrackSet<TimecodeComponent> NewTrack =
	    CreateTrackAndSequence<PackageT, TimecodeComponent>(Header, Package, "Timecode Track",
								tc_edit_rate, TCUL, 1, Dict);

	  NewTrack.Clip = new TimecodeComponent(Dict);
	  Header.AddChildObject(NewTrack.Clip);
	  NewTrack.Sequence->StructuralComponents.push_back(NewTrack.Clip->InstanceUID);
	  NewTrack.Clip->RoundedTimecodeBase = tc_frame_rate;
	  NewTrack.Clip->StartTimecode = TCStart;
	  NewTrack.Clip->DataDefinition = TCUL;

	  return NewTrack;
	}